

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unqlite.c
# Opt level: O0

void unqliteCoreShutdown(void)

{
  unqlite *puVar1;
  unqlite *pNext;
  unqlite *pDb;
  
  pNext = sUnqlMPGlobal.pDB;
  for (; 0 < sUnqlMPGlobal.nDB; sUnqlMPGlobal.nDB = sUnqlMPGlobal.nDB + -1) {
    puVar1 = pNext->pNext;
    unqliteDbRelease(pNext);
    pNext = puVar1;
  }
  SySetRelease(&sUnqlMPGlobal.kv_storage);
  if (sUnqlMPGlobal.sAllocator.pMethods != (SyMemMethods *)0x0) {
    SyMemBackendRelease(&sUnqlMPGlobal.sAllocator);
  }
  sUnqlMPGlobal.nMagic = 0x1764;
  jx9_lib_shutdown();
  return;
}

Assistant:

static void unqliteCoreShutdown(void)
{
	unqlite *pDb, *pNext;
	/* Release all active databases handles */
	pDb = sUnqlMPGlobal.pDB;
	for(;;){
		if( sUnqlMPGlobal.nDB < 1 ){
			break;
		}
		pNext = pDb->pNext;
		unqliteDbRelease(pDb); 
		pDb = pNext;
		sUnqlMPGlobal.nDB--;
	}
	/* Release the storage methods container */
	SySetRelease(&sUnqlMPGlobal.kv_storage);
#if defined(UNQLITE_ENABLE_THREADS)
	/* Release the mutex subsystem */
	if( sUnqlMPGlobal.pMutexMethods ){
		if( sUnqlMPGlobal.pMutex ){
			SyMutexRelease(sUnqlMPGlobal.pMutexMethods, sUnqlMPGlobal.pMutex);
			sUnqlMPGlobal.pMutex = 0;
		}
		if( sUnqlMPGlobal.pMutexMethods->xGlobalRelease ){
			sUnqlMPGlobal.pMutexMethods->xGlobalRelease();
		}
		sUnqlMPGlobal.pMutexMethods = 0;
	}
	sUnqlMPGlobal.nThreadingLevel = 0;
#endif
	if( sUnqlMPGlobal.sAllocator.pMethods ){
		/* Release the memory backend */
		SyMemBackendRelease(&sUnqlMPGlobal.sAllocator);
	}
	sUnqlMPGlobal.nMagic = 0x1764;
	/* Finally, shutdown the Jx9 library */
	jx9_lib_shutdown();
}